

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderFramebufferTextureArgumentRefersToBufferTexture::iterate
          (GeometryShaderFramebufferTextureArgumentRefersToBufferTexture *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *description;
  TestContext *this_02;
  undefined1 local_1a0 [384];
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
               ,0x49c);
  }
  else {
    if ((this->super_TestCaseBase).m_is_texture_buffer_supported != false) {
      iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar3 = CONCAT44(extraout_var,iVar1);
      (**(code **)(lVar3 + 0x6c8))(1,&this->m_bo_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                      ,0x4a8);
      (**(code **)(lVar3 + 0x40))(0x8892,this->m_bo_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                      ,0x4ab);
      (**(code **)(lVar3 + 0x150))(0x8892,8,this->m_texels,0x88e9);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBufferData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                      ,0x4ae);
      (**(code **)(lVar3 + 0x6d0))(1,&this->m_fbo_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glGenFramebuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                      ,0x4b2);
      (**(code **)(lVar3 + 0x78))(0x8d40,this->m_fbo_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                      ,0x4b5);
      (**(code **)(lVar3 + 0x6f8))(1,&this->m_tbo_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glGenTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                      ,0x4b9);
      (**(code **)(lVar3 + 0xb8))(0x8c2a,this->m_tbo_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                      ,0x4bc);
      (**(code **)(lVar3 + 0x12f8))(0x8c2a,0x8d83,this->m_bo_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"glTexBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                      ,0x4bf);
      (**(code **)(lVar3 + 0x690))(0x8d40,0x8ce0,this->m_tbo_id,0);
      iVar1 = (**(code **)(lVar3 + 0x800))();
      if (iVar1 != 0x502) {
        local_1a0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,
                        "Error different than GL_INVALID_OPERATION was generated.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Fail";
      }
      else {
        this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Pass";
      }
      tcu::TestContext::setTestResult(this_02,(uint)(iVar1 != 0x502),description);
      return STOP;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Texture buffer functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
               ,0x4a1);
  }
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderFramebufferTextureArgumentRefersToBufferTexture::iterate()
{
	bool result = false;

	/* This test should only run if EXT_geometry_shader and EXT_texture_buffer are supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate buffer object */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(m_texels), m_texels, GL_DYNAMIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Generate and bind framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	/* Prepare texture buffer */
	gl.genTextures(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.bindTexture(GL_TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texBuffer(GL_TEXTURE_BUFFER, GL_RGB32I, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexBuffer() call failed.");

	glw::GLuint errorEnum;

	/* Test for texture 3D */
	gl.framebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_tbo_id /* texture */, 0 /* level */);
	errorEnum = gl.getError();

	if (errorEnum == GL_INVALID_OPERATION)
	{
		result = true;
	}
	else
	{
		result = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Error different than GL_INVALID_OPERATION was generated."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}